

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O2

int ZPdr_ManDown(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube,Pdr_Set_t *pPred,Hash_Int_t *keep,
                Pdr_Set_t *pIndCube,int *added)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Pdr_Set_t *pPVar4;
  Pdr_Set_t *pPVar5;
  byte bVar6;
  uint i;
  undefined4 in_register_00000034;
  Pdr_Man_t *pPVar7;
  FILE *pFVar8;
  ulong uVar9;
  Pdr_Set_t **ppPVar10;
  long lVar11;
  Pdr_Set_t *pPred_local;
  int local_70;
  uint local_6c;
  Pdr_Set_t **local_68;
  ulong local_60;
  Pdr_Set_t *pCubeMin;
  Pdr_Set_t *local_50;
  Hash_Int_t *local_48;
  Pdr_Set_t *local_40;
  ulong local_38;
  
  local_60 = CONCAT44(in_register_00000034,k);
  iVar1 = p->vSolvers->nSize;
  local_70 = k + -1;
  local_38 = (ulong)(uint)-k;
  iVar2 = 0;
  pPred_local = pPred;
  local_68 = ppCube;
  local_48 = keep;
  local_40 = pIndCube;
  do {
    if (iVar2 != 0) {
      return 1;
    }
    ppPVar10 = local_68;
    if (1 < (int)local_60) {
      local_6c = 0;
      iVar2 = 0;
      while( true ) {
        if (((iVar2 != 0) || (p->pPars->fCtgs == 0)) || (2 < local_6c)) goto LAB_004d7e1a;
        pPVar4 = Pdr_SetDup(pPred_local);
        iVar2 = Pdr_SetIsInit(pPVar4,-1);
        if (iVar2 != 0) break;
        local_50 = pPVar4;
        if (*added == 0) {
          for (iVar2 = 1; (int)local_38 + iVar2 != 1; iVar2 = iVar2 + 1) {
            Pdr_ManSolverAddClause(p,iVar2,pIndCube);
          }
          *added = 1;
        }
        pPVar4 = local_50;
        iVar2 = Pdr_ManCheckCube(p,local_70,local_50,(Pdr_Set_t **)0x0,p->pPars->nConfLimit,0,1);
        if (iVar2 != 1) break;
        pPVar4 = Pdr_ManReduceClause(p,local_70,pPVar4);
        if (pPVar4 == (Pdr_Set_t *)0x0) {
          pCubeMin = pPVar4;
          pPVar4 = Pdr_SetDup(local_50);
        }
        local_6c = local_6c + 1;
        uVar9 = local_60;
        pCubeMin = pPVar4;
        while ((iVar2 = (int)uVar9, iVar2 < iVar1 + -1 &&
               (iVar3 = Pdr_ManCheckCube(p,iVar2,pPVar4,(Pdr_Set_t **)0x0,0,0,1), iVar3 != 0))) {
          uVar9 = (ulong)(iVar2 + 1);
        }
        pPVar7 = p;
        iVar3 = ZPdr_ManSimpleMic(p,iVar2 + -1,&pCubeMin);
        if (iVar3 == -1) {
          __assert_fail("micResult != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x19c,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        pPVar4 = pCubeMin;
        if (p->pPars->fVeryVerbose != 0) {
          Abc_Print((int)pPVar7,"Adding cube ");
          pPVar4 = pCubeMin;
          pFVar8 = _stdout;
          Pdr_SetPrint(_stdout,pCubeMin,p->pAig->nRegs,(Vec_Int_t *)0x0);
          Abc_Print((int)pFVar8," to frame %d.\n",uVar9 & 0xffffffff);
        }
        for (lVar11 = 0; lVar11 < pPVar4->nLits; lVar11 = lVar11 + 1) {
          if ((int)*(uint *)(&pPVar4->field_0x14 + lVar11 * 4) < 0) {
            __assert_fail("pCubeMin->Lits[i] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                          ,0x1a8,
                          "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                         );
          }
          i = *(uint *)(&pPVar4->field_0x14 + lVar11 * 4) >> 1;
          if (p->pAig->nRegs <= (int)i) {
            __assert_fail("(pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                          ,0x1a9,
                          "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                         );
          }
          iVar3 = Vec_IntEntry(p->vPrio,i);
          bVar6 = (byte)p->nPrioShift;
          if (iVar3 >> (bVar6 & 0x1f) == 0) {
            p->nAbsFlops = p->nAbsFlops + 1;
          }
          Vec_IntAddToEntry(p->vPrio,*(int *)(&pPVar4->field_0x14 + lVar11 * 4) / 2,
                            1 << (bVar6 & 0x1f));
        }
        Vec_VecPush(p->vClauses,iVar2,pPVar4);
        p->nCubes = p->nCubes + 1;
        iVar3 = 0;
        while (iVar2 != iVar3) {
          iVar3 = iVar3 + 1;
          Pdr_ManSolverAddClause(p,iVar3,pPVar4);
        }
        Pdr_SetDeref(pPred_local);
        ppPVar10 = local_68;
        iVar2 = Pdr_ManCheckCube(p,(int)local_60,*local_68,&pPred_local,p->pPars->nConfLimit,0,1);
        if (iVar2 < 0) {
          __assert_fail("RetValue >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCore.c"
                        ,0x1b6,
                        "int ZPdr_ManDown(Pdr_Man_t *, int, Pdr_Set_t **, Pdr_Set_t *, Hash_Int_t *, Pdr_Set_t *, int *)"
                       );
        }
        Pdr_SetDeref(local_50);
        pIndCube = local_40;
        if (iVar2 == 1) {
          return 1;
        }
      }
      Pdr_SetDeref(pPVar4);
    }
LAB_004d7e1a:
    if (p->pPars->fVeryVerbose != 0) {
      puts("Cube:");
      ZPdr_SetPrint(*ppPVar10);
      puts("\nPred:");
      ZPdr_SetPrint(pPred_local);
    }
    pPVar4 = *ppPVar10;
    pPVar5 = ZPdr_SetIntersection(pPVar4,pPred_local,local_48);
    *ppPVar10 = pPVar5;
    Pdr_SetDeref(pPVar4);
    Pdr_SetDeref(pPred_local);
    pPVar4 = *ppPVar10;
    if (pPVar4 == (Pdr_Set_t *)0x0) {
      return 0;
    }
    if (p->pPars->fVeryVerbose != 0) {
      puts("Intersection:");
      ppPVar10 = local_68;
      ZPdr_SetPrint(*local_68);
      pPVar4 = *ppPVar10;
    }
    iVar2 = Pdr_SetIsInit(pPVar4,-1);
    ppPVar10 = local_68;
    if (iVar2 != 0) {
      if (p->pPars->fVeryVerbose != 0) {
        puts("Failed initiation");
        return 0;
      }
      return 0;
    }
    iVar2 = Pdr_ManCheckCube(p,(int)local_60,*local_68,&pPred_local,p->pPars->nConfLimit,0,1);
    if (iVar2 == 0) {
      if ((*ppPVar10)->nLits == 1) {
        Pdr_SetDeref(pPred_local);
        return 0;
      }
    }
    else {
      if (iVar2 == -1) {
        return -1;
      }
      if (iVar2 == 1) {
        return 1;
      }
    }
  } while( true );
}

Assistant:

int ZPdr_ManDown( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube, Pdr_Set_t * pPred, Hash_Int_t * keep, Pdr_Set_t * pIndCube, int * added )
{
    int RetValue = 0, CtgRetValue, i, ctgAttempts, l, micResult;
    int kMax = Vec_PtrSize(p->vSolvers)-1;
    Pdr_Set_t * pCubeTmp, * pCubeMin, * pCtg;
    while ( RetValue == 0 )
    {
        ctgAttempts = 0;
        while ( p->pPars->fCtgs && RetValue == 0 && k > 1 && ctgAttempts < 3 )
        {
            pCtg = Pdr_SetDup( pPred );
            //Check CTG for inductiveness
            if ( Pdr_SetIsInit( pCtg, -1 ) )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            if (*added == 0)
            {
                for ( i = 1; i <= k; i++ )
                    Pdr_ManSolverAddClause( p, i, pIndCube);
                *added = 1;
            }
            ctgAttempts++;
            CtgRetValue = Pdr_ManCheckCube( p, k-1, pCtg, NULL, p->pPars->nConfLimit, 0, 1 );
            if ( CtgRetValue != 1 )
            {
                Pdr_SetDeref( pCtg );
                break;
            }
            pCubeMin = Pdr_ManReduceClause( p, k-1, pCtg );
            if ( pCubeMin == NULL )
                pCubeMin = Pdr_SetDup ( pCtg );

            for ( l = k; l < kMax; l++ )
                if ( !Pdr_ManCheckCube( p, l, pCubeMin, NULL, 0, 0, 1 ) )
                    break;
            micResult = ZPdr_ManSimpleMic( p, l-1, &pCubeMin );
            assert ( micResult != -1 );

            // add new clause
            if ( p->pPars->fVeryVerbose )
            {
                Abc_Print( 1, "Adding cube " );
                Pdr_SetPrint( stdout, pCubeMin, Aig_ManRegNum(p->pAig), NULL );
                Abc_Print( 1, " to frame %d.\n", l );
            }
            // set priority flops
            for ( i = 0; i < pCubeMin->nLits; i++ )
            {
                assert( pCubeMin->Lits[i] >= 0 );
                assert( (pCubeMin->Lits[i] / 2) < Aig_ManRegNum(p->pAig) );
                if ( (Vec_IntEntry(p->vPrio, pCubeMin->Lits[i] / 2) >> p->nPrioShift) == 0 )
                    p->nAbsFlops++;
                Vec_IntAddToEntry( p->vPrio, pCubeMin->Lits[i] / 2, 1 << p->nPrioShift );
            }

            Vec_VecPush( p->vClauses, l, pCubeMin );   // consume ref
            p->nCubes++;
            // add clause
            for ( i = 1; i <= l; i++ )
                Pdr_ManSolverAddClause( p, i, pCubeMin );
            Pdr_SetDeref( pPred );
            RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
            assert( RetValue >= 0 );
            Pdr_SetDeref( pCtg );
            if ( RetValue == 1 )
            {
                //printf ("IT'S A ONE\n");
                return 1;
            }
        }

        //join
        if ( p->pPars->fVeryVerbose )
        {
            printf("Cube:\n");
            ZPdr_SetPrint( *ppCube );
            printf("\nPred:\n");
            ZPdr_SetPrint( pPred );
        }
        *ppCube = ZPdr_SetIntersection( pCubeTmp = *ppCube, pPred, keep );
        Pdr_SetDeref( pCubeTmp );
        Pdr_SetDeref( pPred );
        if ( *ppCube == NULL )
            return 0;
        if ( p->pPars->fVeryVerbose )
        {
            printf("Intersection:\n");
            ZPdr_SetPrint( *ppCube );
        }
        if ( Pdr_SetIsInit( *ppCube, -1 ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf ("Failed initiation\n");
            return 0;
        }
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, &pPred, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        if ( RetValue == 1 )
        {
            //printf ("*********IT'S A ONE\n");
            break;
        }
        if ( RetValue == 0 && (*ppCube)->nLits == 1)
        {
            Pdr_SetDeref( pPred ); // fixed memory leak
            // A workaround for the incomplete assignment returned by the SAT
            // solver
            return 0;
        }
    }
    return 1;
}